

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_externkind_t wasm_extern_kind(wasm_extern_t *extern_)

{
  wasm_externkind_t wVar1;
  int iVar2;
  Extern *pEVar3;
  undefined4 extraout_var;
  wasm_extern_t *extern__local;
  
  pEVar3 = wasm_ref_t::As<wabt::interp::Extern>(&extern_->super_wasm_ref_t);
  iVar2 = (*(pEVar3->super_Object)._vptr_Object[4])();
  wVar1 = FromWabtExternKind(*(ExternKind *)(CONCAT44(extraout_var,iVar2) + 8));
  return wVar1;
}

Assistant:

wasm_externkind_t wasm_extern_kind(const wasm_extern_t* extern_) {
  return FromWabtExternKind(extern_->As<Extern>()->extern_type().kind);
}